

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  uVar4 = (long)end - (long)ptr;
  if ((long)uVar4 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  iVar5 = 0;
  if (bVar1 - 0xd8 < 4) {
LAB_004ec567:
    iVar6 = iVar5;
    if (uVar4 < 4) {
      return -2;
    }
    goto switchD_004ec54f_caseD_17;
  }
  iVar6 = 0;
  if (bVar1 - 0xdc < 4) goto switchD_004ec54f_caseD_17;
  if (bVar1 == 0) {
    bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    iVar6 = iVar5;
    switch(bVar3) {
    case 0x16:
    case 0x18:
      goto switchD_004ec54f_caseD_16;
    case 0x17:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      break;
    case 0x1d:
      goto switchD_004ec54f_caseD_1d;
    default:
      if (1 < bVar3 - 9) {
        if (bVar3 == 6) {
          if (uVar4 == 2) {
            return -2;
          }
          break;
        }
        if (bVar3 != 7) break;
        goto LAB_004ec567;
      }
    case 0x15:
    case 0x1e:
      iVar6 = 0x16;
    }
  }
  else {
    if ((bVar1 == 0xff) && (iVar6 = iVar5, 0xfd < (byte)ptr[1])) goto switchD_004ec54f_caseD_17;
switchD_004ec54f_caseD_1d:
    iVar6 = iVar5;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) != 0) {
switchD_004ec54f_caseD_16:
      ptr = ptr + 4;
LAB_004ec48f:
      uVar4 = uVar4 - 2;
      if ((long)uVar4 < 2) {
        return -1;
      }
      bVar1 = ptr[-2];
      if (bVar1 != 0) {
        if (bVar1 == 0xff) {
          if ((byte)ptr[-1] < 0xfe) goto switchD_004ec519_caseD_1d;
        }
        else if (bVar1 - 0xd8 < 4) {
LAB_004ec590:
          if (uVar4 < 4) {
            return -2;
          }
        }
        else if (3 < bVar1 - 0xdc) goto switchD_004ec519_caseD_1d;
        goto switchD_004ec519_caseD_13;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[-1]);
      switch(cVar2) {
      case '\x12':
        iVar6 = 0x1c;
        goto switchD_004ec54f_caseD_17;
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
      case '\x1c':
        break;
      case '\x16':
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1b':
        goto switchD_004ec519_caseD_16;
      case '\x1d':
switchD_004ec519_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)ptr[-1] & 0x1f) & 1) != 0) goto switchD_004ec519_caseD_16;
        break;
      default:
        if (cVar2 == '\x06') {
          if (uVar4 == 2) {
            return -2;
          }
        }
        else if (cVar2 == '\a') goto LAB_004ec590;
      }
switchD_004ec519_caseD_13:
      ptr = ptr + -2;
      iVar6 = iVar5;
    }
  }
switchD_004ec54f_caseD_17:
  *nextTokPtr = ptr;
  return iVar6;
switchD_004ec519_caseD_16:
  ptr = ptr + 2;
  goto LAB_004ec48f;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}